

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall CVmFormatterLog::close_log_file(CVmFormatterLog *this)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  uint uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  long *plVar6;
  int in_ESI;
  bool bVar7;
  err_frame_t err_cur__;
  
  if ((FILE *)this->logfp_ != (FILE *)0x0) {
    fclose((FILE *)this->logfp_);
    this->logfp_ = (osfildef *)0x0;
  }
  if (this->lognf_ == (CVmNetFile *)0x0) {
    uVar3 = 0;
  }
  else {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar4;
    uVar5 = _ZTW11G_err_frame();
    *(err_frame_t **)uVar5 = &err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      CVmNetFile::close(this->lognf_,in_ESI);
    }
    peVar1 = err_cur__.prv_;
    bVar7 = err_cur__.state_ == 1;
    if (bVar7) {
      err_cur__.state_ = 2;
    }
    uVar3 = (uint)bVar7;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = peVar1;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar6 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar6 + 0x10));
      }
      pCVar2 = err_cur__.exc_;
      plVar6 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar6 + 0x10) = pCVar2;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    this->lognf_ = (CVmNetFile *)0x0;
  }
  if (this->logglob_ != (vm_globalvar_t *)0x0) {
    (this->logglob_->val).typ = VM_NIL;
  }
  return uVar3;
}

Assistant:

int CVmFormatterLog::close_log_file(VMG0_)
{
    /* presume success */
    int err = FALSE;
    
    /* if we have a file, close it */
    if (logfp_ != 0)
    {
        /* close and forget the handle */
        osfcls(logfp_);
        logfp_ = 0;
    }

    /* forget the log network file descriptor, if we have one */
    if (lognf_ != 0)
    {
        err_try
        {
            lognf_->close(vmg0_);
        }
        err_catch_disc
        {
            /* flag the error, but otherwise discard the exception */
            err = TRUE;
        }